

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  long lVar1;
  __sighandler_t __handler;
  int __sig;
  long lVar2;
  bool bVar3;
  StorageArray<boost::signals2::scoped_connection> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  SignalType s;
  allocator local_99;
  StorageArray<boost::signals2::scoped_connection> local_98;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  anon_class_16_2_8e986c60 local_68 [2];
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  local_38;
  
  lVar1 = context->_iterationsCount;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/boost.hpp:66:45)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/boost.hpp:66:45)>
             ::_M_manager;
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::signal(&local_38,(int)local_68,(__sighandler_t)&local_98);
  StorageArray<boost::signals2::scoped_connection>::StorageArray(&local_98,numSlots);
  local_68[0].handler = (HandlerType *)&local_88;
  local_68[0].s = &local_38;
  StorageArray<boost::signals2::scoped_connection>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (&local_98,local_68);
  std::__cxx11::string::string((string *)local_68,"invoke",&local_99);
  (*context->_vptr_BenchmarkContext[3])(local_48,context,local_68,numSlots * lVar1);
  std::__cxx11::string::~string((string *)local_68);
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  while( true ) {
    __sig = (int)context;
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::operator()(&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  StorageArray<boost::signals2::scoped_connection>::Destruct(&local_98);
  StorageArray<boost::signals2::scoped_connection>::~StorageArray(&local_98);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::~signal(&local_38,__sig,__handler);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }